

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableRawRepeatedField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,CppType cpptype,
          int ctype,Descriptor *desc)

{
  int *piVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  Label LVar4;
  CppType CVar5;
  FieldOptions_CType FVar6;
  int number;
  FieldOptions *this_00;
  Descriptor *pDVar7;
  LogMessage *pLVar8;
  ExtensionSet *this_01;
  char *pcVar9;
  int __c;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  Descriptor *local_38;
  Descriptor *desc_local;
  int ctype_local;
  CppType cpptype_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  local_38 = desc;
  desc_local._0_4_ = ctype;
  desc_local._4_4_ = cpptype;
  _ctype_local = (LogMessage *)field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  LVar4 = FieldDescriptor::label(field);
  if (LVar4 != LABEL_REPEATED) {
    message = (Message *)_ctype_local;
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)_ctype_local,"\"MutableRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  CVar5 = FieldDescriptor::cpp_type((FieldDescriptor *)_ctype_local);
  if (CVar5 != desc_local._4_4_) {
    message = (Message *)_ctype_local;
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,(FieldDescriptor *)_ctype_local,"MutableRawRepeatedField",
               desc_local._4_4_);
  }
  if (-1 < (int)(FieldOptions_CType)desc_local) {
    this_00 = FieldDescriptor::options((FieldDescriptor *)_ctype_local);
    FVar6 = FieldOptions::ctype(this_00);
    local_71 = 0;
    if (FVar6 != (FieldOptions_CType)desc_local) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x455);
      local_71 = 1;
      pLVar8 = LogMessage::operator<<
                         (&local_70,"CHECK failed: (field->options().ctype()) == (ctype): ");
      message = (Message *)LogMessage::operator<<(pLVar8,"subtype mismatch");
      LogFinisher::operator=(local_85,(LogMessage *)message);
    }
    if ((local_71 & 1) != 0) {
      LogMessage::~LogMessage(&local_70);
    }
  }
  if (local_38 != (Descriptor *)0x0) {
    pDVar7 = FieldDescriptor::message_type((FieldDescriptor *)_ctype_local);
    local_c1 = 0;
    if (pDVar7 != local_38) {
      LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x457);
      local_c1 = 1;
      pLVar8 = LogMessage::operator<<(&local_c0,"CHECK failed: (field->message_type()) == (desc): ")
      ;
      message = (Message *)LogMessage::operator<<(pLVar8,"wrong submessage type");
      LogFinisher::operator=(&local_c2,(LogMessage *)message);
    }
    if ((local_c1 & 1) != 0) {
      LogMessage::~LogMessage(&local_c0);
    }
  }
  bVar3 = FieldDescriptor::is_extension((FieldDescriptor *)_ctype_local);
  pFVar2 = field_local;
  if (bVar3) {
    this_01 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number((FieldDescriptor *)_ctype_local);
    this_local = (GeneratedMessageReflection *)ExtensionSet::MutableRawRepeatedField(this_01,number)
    ;
  }
  else {
    piVar1 = this->offsets_;
    pcVar9 = FieldDescriptor::index((FieldDescriptor *)_ctype_local,(char *)message,__c);
    this_local = (GeneratedMessageReflection *)(pFVar2 + piVar1[(int)pcVar9]);
  }
  return this_local;
}

Assistant:

void* GeneratedMessageReflection::MutableRawRepeatedField(
    Message* message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpptype,
    int ctype, const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  if (field->cpp_type() != cpptype)
    ReportReflectionUsageTypeError(descriptor_,
        field, "MutableRawRepeatedField", cpptype);
  if (ctype >= 0)
    GOOGLE_CHECK_EQ(field->options().ctype(), ctype) << "subtype mismatch";
  if (desc != NULL)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension())
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number());
  else
    return reinterpret_cast<uint8*>(message) + offsets_[field->index()];
}